

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogLocalResolve(void *catalogs,xmlChar *pubID,xmlChar *sysID)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *ret;
  xmlCatalogEntryPtr catal;
  xmlChar *sysID_local;
  xmlChar *pubID_local;
  void *catalogs_local;
  
  if (xmlCatalogInitialized == 0) {
    xmlInitializeCatalog();
  }
  if ((pubID == (xmlChar *)0x0) && (sysID == (xmlChar *)0x0)) {
    catalogs_local = (void *)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      if ((pubID == (xmlChar *)0x0) || (sysID == (xmlChar *)0x0)) {
        if (pubID == (xmlChar *)0x0) {
          pp_Var2 = __xmlGenericError();
          p_Var1 = *pp_Var2;
          ppvVar3 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar3,"Local Resolve: sysID %s\n",sysID);
        }
        else {
          pp_Var2 = __xmlGenericError();
          p_Var1 = *pp_Var2;
          ppvVar3 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar3,"Local Resolve: pubID %s\n",pubID);
        }
      }
      else {
        pp_Var2 = __xmlGenericError();
        p_Var1 = *pp_Var2;
        ppvVar3 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar3,"Local Resolve: pubID %s sysID %s\n",pubID,sysID);
      }
    }
    if (catalogs == (void *)0x0) {
      catalogs_local = (void *)0x0;
    }
    else {
      catalogs_local = xmlCatalogListXMLResolve((xmlCatalogEntryPtr)catalogs,pubID,sysID);
      if (((xmlChar *)catalogs_local == (xmlChar *)0x0) ||
         ((xmlChar *)catalogs_local == (xmlChar *)0xffffffffffffffff)) {
        catalogs_local = (void *)0x0;
      }
    }
  }
  return (xmlChar *)catalogs_local;
}

Assistant:

xmlChar *
xmlCatalogLocalResolve(void *catalogs, const xmlChar *pubID,
	               const xmlChar *sysID) {
    xmlCatalogEntryPtr catal;
    xmlChar *ret;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    if (xmlDebugCatalogs) {
        if ((pubID != NULL) && (sysID != NULL)) {
            xmlGenericError(xmlGenericErrorContext,
                            "Local Resolve: pubID %s sysID %s\n", pubID, sysID);
        } else if (pubID != NULL) {
            xmlGenericError(xmlGenericErrorContext,
                            "Local Resolve: pubID %s\n", pubID);
        } else {
            xmlGenericError(xmlGenericErrorContext,
                            "Local Resolve: sysID %s\n", sysID);
        }
    }

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return(NULL);
    ret = xmlCatalogListXMLResolve(catal, pubID, sysID);
    if ((ret != NULL) && (ret != XML_CATAL_BREAK))
	return(ret);
    return(NULL);
}